

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group.cpp
# Opt level: O2

idx_t __thiscall
duckdb::RowGroup::GetSelVector
          (RowGroup *this,TransactionData transaction,idx_t vector_idx,SelectionVector *sel_vector,
          idx_t max_count)

{
  RowVersionManager *this_00;
  optional_ptr<duckdb::RowVersionManager,_true> vinfo;
  optional_ptr<duckdb::RowVersionManager,_true> local_28;
  
  local_28 = GetVersionInfo(this);
  if (local_28.ptr != (RowVersionManager *)0x0) {
    this_00 = optional_ptr<duckdb::RowVersionManager,_true>::operator->(&local_28);
    max_count = RowVersionManager::GetSelVector(this_00,transaction,vector_idx,sel_vector,max_count)
    ;
  }
  return max_count;
}

Assistant:

idx_t RowGroup::GetSelVector(TransactionData transaction, idx_t vector_idx, SelectionVector &sel_vector,
                             idx_t max_count) {
	auto vinfo = GetVersionInfo();
	if (!vinfo) {
		return max_count;
	}
	return vinfo->GetSelVector(transaction, vector_idx, sel_vector, max_count);
}